

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  int *in_RSI;
  long in_RDI;
  double *in_stack_00000080;
  string *in_stack_00000088;
  XmlWriter *in_stack_00000090;
  string *in_stack_fffffffffffffeb8;
  XmlWriter *in_stack_fffffffffffffec0;
  XmlWriter *this_00;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  int local_70;
  undefined1 local_69 [57];
  string local_30 [32];
  int *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"OverallResultsAsserts",(allocator *)(local_69 + 0x38));
  XmlWriter::startElement(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this_00 = (XmlWriter *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"successes",(allocator *)this_00);
  local_70 = *local_10 - local_10[1];
  XmlWriter::writeAttribute<int>(in_stack_00000090,in_stack_00000088,(int *)in_stack_00000080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"failures",&local_91);
  XmlWriter::writeAttribute<int>(in_stack_00000090,in_stack_00000088,(int *)in_stack_00000080);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)(local_69 + 0x38));
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x77) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"duration",&local_b9);
    XmlWriter::writeAttribute<double>(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  if (*(int *)(*(long *)(in_RDI + 0x80) + 0x40) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"expected_failures",&local_e1);
    XmlWriter::writeAttribute<int>(in_stack_00000090,in_stack_00000088,(int *)in_stack_00000080);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }